

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O0

void __thiscall TasGrid::GridFourier::differentiate(GridFourier *this,double *x,double *jacobian)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  int *piVar6;
  reference pvVar7;
  int iVar8;
  int local_104;
  double phase;
  int j;
  int k;
  double *fcimag;
  double *fcreal;
  int *p;
  int i;
  vector<double,_std::allocator<double>_> wimag;
  allocator<double> local_49;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> wreal;
  int num_points;
  double *jacobian_local;
  double *x_local;
  GridFourier *this_local;
  
  iVar3 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
  wreal.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::fill_n<double*,int,double>
            (jacobian,(this->super_BaseCanonicalGrid).num_outputs *
                      (this->super_BaseCanonicalGrid).num_dimensions,
             (double *)
             &wreal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<double>::allocator(&local_49);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_48,(long)iVar3,&local_49);
  ::std::allocator<double>::~allocator(&local_49);
  ::std::allocator<double>::allocator((allocator<double> *)((long)&p + 7));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,(long)iVar3,
             (allocator<double> *)((long)&p + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&p + 7));
  pdVar4 = ::std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_48);
  pdVar5 = ::std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)&i);
  computeBasis<double,false>(this,&(this->super_BaseCanonicalGrid).points,x,pdVar4,pdVar5);
  for (p._0_4_ = 0; (int)p < iVar3; p._0_4_ = (int)p + 1) {
    piVar6 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,(int)p);
    pdVar4 = Data2D<double>::getStrip(&this->fourier_coefs,(int)p);
    pdVar5 = Data2D<double>::getStrip(&this->fourier_coefs,(int)p + iVar3);
    for (phase._4_4_ = 0; phase._4_4_ < (this->super_BaseCanonicalGrid).num_outputs;
        phase._4_4_ = phase._4_4_ + 1) {
      for (phase._0_4_ = 0; phase._0_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
          phase._0_4_ = phase._0_4_ + 1) {
        if (piVar6[phase._0_4_] % 2 == 0) {
          local_104 = piVar6[phase._0_4_];
        }
        else {
          local_104 = -1 - piVar6[phase._0_4_];
        }
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&i,(long)(int)p);
        dVar1 = *pvVar7;
        dVar2 = pdVar4[phase._4_4_];
        pvVar7 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_48,(long)(int)p);
        iVar8 = phase._4_4_ * (this->super_BaseCanonicalGrid).num_dimensions + phase._0_4_;
        jacobian[iVar8] =
             -((double)local_104 * 3.141592653589793) *
             (dVar1 * dVar2 + *pvVar7 * pdVar5[phase._4_4_]) + jacobian[iVar8];
      }
    }
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  return;
}

Assistant:

void GridFourier::differentiate(const double x[], double jacobian[]) const {
    /* From GridFourier::evaluate(), the contribution of a particular point/tensor to the surrogate model at a point x is
     *
     *     p(x) := Re[w] * Re[exp(c*x*I)] - Im[w] * Im[exp(c*x*I)],
     *
     * where w is a complex scalar, c is a real scalar, and I^2 = -1. Hence, the derivative is
     *
     *     p'(x) := -c * ( Re[w] * Im[exp(c*x*I)] + Im[w] * Re[exp(c*x*I)] ).
     */
    int num_points = points.getNumIndexes();
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    std::vector<double> wreal(num_points), wimag(num_points);
    computeBasis<double, false>(points, x, wreal.data(), wimag.data());
    for(int i=0; i<num_points; i++) {
        const int *p = points.getIndex(i);
        const double *fcreal = fourier_coefs.getStrip(i);
        const double *fcimag = fourier_coefs.getStrip(i + num_points);
        for(int k=0; k<num_outputs; k++) {
            for(int j=0; j<num_dimensions; j++) {
                double phase = Maths::pi * (double) (p[j] % 2 == 0 ? p[j] : -p[j]-1);
                jacobian[k * num_dimensions + j] += -phase * (wimag[i] * fcreal[k] + wreal[i] * fcimag[k]);
            }
        }
    }
}